

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O2

void init_player(void)

{
  player *ppVar1;
  player_upkeep *ppVar2;
  object **ppoVar3;
  int16_t *piVar4;
  object *poVar5;
  _Bool *p_Var6;
  curse_data *pcVar7;
  
  player = (player *)mem_zalloc(0x4c8);
  ppVar2 = (player_upkeep *)mem_zalloc(0x98);
  player->upkeep = ppVar2;
  ppoVar3 = (object **)mem_zalloc((ulong)z_info->pack_size * 8 + 8);
  player->upkeep->inven = ppoVar3;
  ppoVar3 = (object **)mem_zalloc((ulong)z_info->quiver_size << 3);
  player->upkeep->quiver = ppoVar3;
  piVar4 = (int16_t *)mem_zalloc(0x6a);
  player->timed = piVar4;
  poVar5 = object_new();
  player->obj_k = poVar5;
  p_Var6 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
  player->obj_k->brands = p_Var6;
  p_Var6 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
  player->obj_k->slays = p_Var6;
  pcVar7 = (curse_data *)mem_zalloc((ulong)z_info->curse_max << 3);
  ppVar1 = player;
  player->obj_k->curses = pcVar7;
  options_init_defaults(&ppVar1->opts);
  return;
}

Assistant:

static void init_player(void) {
	/* Create the player array, initialised with 0 */
	player = mem_zalloc(sizeof *player);

	/* Allocate player sub-structs */
	player->upkeep = mem_zalloc(sizeof(struct player_upkeep));
	player->upkeep->inven = mem_zalloc((z_info->pack_size + 1) * sizeof(struct object *));
	player->upkeep->quiver = mem_zalloc(z_info->quiver_size * sizeof(struct object *));
	player->timed = mem_zalloc(TMD_MAX * sizeof(int16_t));
	player->obj_k = object_new();
	player->obj_k->brands = mem_zalloc(z_info->brand_max * sizeof(bool));
	player->obj_k->slays = mem_zalloc(z_info->slay_max * sizeof(bool));
	player->obj_k->curses = mem_zalloc(z_info->curse_max *
									   sizeof(struct curse_data));

	options_init_defaults(&player->opts);
}